

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

_List_iterator<cs_impl::any> __thiscall
cs_impl::
cni_helper<std::_List_iterator<cs_impl::any>(*)(std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>&,std::_List_iterator<cs_impl::any>&,cs_impl::any_const&),std::_List_iterator<cs_impl::any>(*)(std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>&,std::_List_iterator<cs_impl::any>&,cs_impl::any_const&)>
::_call<0,1,2>(cni_helper<std::_List_iterator<cs_impl::any>_(*)(std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&,_std::_List_iterator<cs_impl::any>_&,_const_cs_impl::any_&),_std::_List_iterator<cs_impl::any>_(*)(std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&,_std::_List_iterator<cs_impl::any>_&,_const_cs_impl::any_&)>
               *this,vector *args,sequence<0,_1,_2> *param_3)

{
  list<cs_impl::any,_std::allocator<cs_impl::any>_> *__args_1;
  list<cs_impl::any,_std::allocator<cs_impl::any>_> *__args;
  reference val;
  _List_iterator<cs_impl::any> *p_Var1;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *in_RSI;
  any *in_RDI;
  var *in_stack_000000d0;
  var *in_stack_000000e0;
  _List_iterator<cs_impl::any> in_stack_ffffffffffffffd8;
  
  std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[](in_RSI,0);
  __args_1 = try_convert_and_check<std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&,_std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&,_std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>,_0UL>
             ::convert(in_stack_000000e0);
  std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[](in_RSI,1);
  __args = (list<cs_impl::any,_std::allocator<cs_impl::any>_> *)
           try_convert_and_check<std::_List_iterator<cs_impl::any>_&,_std::_List_iterator<cs_impl::any>_&,_std::_List_iterator<cs_impl::any>,_1UL>
           ::convert(in_stack_000000d0);
  val = std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[](in_RSI,2);
  try_convert_and_check<const_cs_impl::any_&,_const_cs_impl::any_&,_cs_impl::any,_2UL>::convert(val)
  ;
  std::
  function<std::_List_iterator<cs_impl::any>_(std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&,_std::_List_iterator<cs_impl::any>_&,_const_cs_impl::any_&)>
  ::operator()((function<std::_List_iterator<cs_impl::any>_(std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_&,_std::_List_iterator<cs_impl::any>_&,_const_cs_impl::any_&)>
                *)in_stack_ffffffffffffffd8._M_node,__args,(_List_iterator<cs_impl::any> *)__args_1,
               in_RDI);
  p_Var1 = type_convertor<std::_List_iterator<cs_impl::any>,std::_List_iterator<cs_impl::any>>::
           convert<std::_List_iterator<cs_impl::any>>
                     ((_List_iterator<cs_impl::any> *)&stack0xffffffffffffffd8);
  return (_List_iterator<cs_impl::any>)p_Var1->_M_node;
}

Assistant:

_Source_RetT _call(cs::vector &args, const cov::sequence<S...> &) const
		{
			return type_convertor<_Target_RetT, _Source_RetT>::convert(
			           mFunc(try_convert<_Target_ArgsT, _Source_ArgsT, S>::convert(args[S])...));
		}